

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void ftruncate_cb(uv_fs_t *req)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (req == &ftruncate_req) {
    if (ftruncate_req.fs_type == UV_FS_FTRUNCATE) {
      if (ftruncate_req.result == 0) {
        ftruncate_cb_count = ftruncate_cb_count + 1;
        uv_fs_req_cleanup(&ftruncate_req);
        iVar1 = uv_fs_close(loop,&close_req,(undefined4)open_req1.result,close_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar3 = "r == 0";
        uVar2 = 0x18c;
      }
      else {
        pcVar3 = "req->result == 0";
        uVar2 = 0x188;
      }
    }
    else {
      pcVar3 = "req->fs_type == UV_FS_FTRUNCATE";
      uVar2 = 0x187;
    }
  }
  else {
    pcVar3 = "req == &ftruncate_req";
    uVar2 = 0x186;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

static void ftruncate_cb(uv_fs_t* req) {
  int r;
  ASSERT(req == &ftruncate_req);
  ASSERT(req->fs_type == UV_FS_FTRUNCATE);
  ASSERT(req->result == 0);
  ftruncate_cb_count++;
  uv_fs_req_cleanup(req);
  r = uv_fs_close(loop, &close_req, open_req1.result, close_cb);
  ASSERT(r == 0);
}